

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option_inl.hpp
# Opt level: O0

void __thiscall
CLI::OptionBase<CLI::OptionDefaults>::copy_to<CLI::Option>
          (OptionBase<CLI::OptionDefaults> *this,Option *other)

{
  Option *other_local;
  OptionBase<CLI::OptionDefaults> *this_local;
  
  OptionBase<CLI::Option>::group(&other->super_OptionBase<CLI::Option>,&this->group_);
  OptionBase<CLI::Option>::required
            (&other->super_OptionBase<CLI::Option>,(bool)(this->required_ & 1));
  Option::ignore_case<CLI::App>(other,(bool)(this->ignore_case_ & 1));
  Option::ignore_underscore<CLI::App>(other,(bool)(this->ignore_underscore_ & 1));
  OptionBase<CLI::Option>::configurable
            (&other->super_OptionBase<CLI::Option>,(bool)(this->configurable_ & 1));
  Option::disable_flag_override(other,(bool)(this->disable_flag_override_ & 1));
  OptionBase<CLI::Option>::delimiter(&other->super_OptionBase<CLI::Option>,this->delimiter_);
  OptionBase<CLI::Option>::always_capture_default
            (&other->super_OptionBase<CLI::Option>,(bool)(this->always_capture_default_ & 1));
  Option::multi_option_policy(other,this->multi_option_policy_);
  return;
}

Assistant:

void OptionBase<CRTP>::copy_to(T *other) const {
    other->group(group_);
    other->required(required_);
    other->ignore_case(ignore_case_);
    other->ignore_underscore(ignore_underscore_);
    other->configurable(configurable_);
    other->disable_flag_override(disable_flag_override_);
    other->delimiter(delimiter_);
    other->always_capture_default(always_capture_default_);
    other->multi_option_policy(multi_option_policy_);
}